

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  char cVar7;
  ImGuiWindow *pIVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  ImU32 id;
  byte *pbVar13;
  uint uVar14;
  int iVar15;
  byte bVar16;
  ulong uVar17;
  char *pcVar18;
  ImGuiTableColumn *pIVar19;
  float *pfVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  ImGuiTableColumn *pIVar24;
  ulong uVar25;
  bool bVar26;
  uint uVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  ImRect host_clip_rect;
  undefined1 local_c8 [16];
  ImRect local_68;
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar9 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x2342,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  fVar29 = (table->WorkRect).Min.x;
  fVar1 = (table->WorkRect).Min.y;
  fVar2 = (pIVar9->Style).FramePadding.x;
  fVar32 = table->CellPaddingX;
  fVar30 = fVar32 + fVar32 + fVar2 + table->CellSpacingX1 + table->CellSpacingX2;
  fVar38 = (table->WorkRect).Max.x;
  table->LeftMostStretchedColumnDisplayOrder = -1;
  uVar14 = table->ColumnsCount;
  if ((int)uVar14 < 1) {
    iVar15 = 0;
    fVar33 = 0.0;
    fVar36 = 0.0;
    local_c8 = ZEXT816(0);
  }
  else {
    local_58 = ZEXT416((uint)(fVar2 * 4.0));
    lVar21 = 0;
    uVar23 = 0;
    iVar15 = 0;
    local_c8 = ZEXT816(0);
    fVar36 = 0.0;
    fVar33 = 0.0;
    do {
      if ((table->VisibleMaskByIndex >> (uVar23 & 0x3f) & 1) != 0) {
        pIVar19 = (table->Columns).Data;
        pIVar24 = (ImGuiTableColumn *)((long)&(pIVar19->ClipRect).Min.x + lVar21);
        if ((table->Columns).DataEnd <= pIVar24) goto LAB_002bf144;
        uVar12 = TableFixColumnFlags(table,*(ImGuiTableColumnFlags *)
                                            ((long)&pIVar19->FlagsIn + lVar21));
        uVar14 = (uint)(lVar21 != 0) * 0x8000 + 0x8000;
        if ((uVar12 & 0x18000) != 0) {
          uVar14 = 0;
        }
        uVar14 = uVar14 | uVar12;
        *(uint *)((long)&pIVar19->Flags + lVar21) = uVar14;
        uVar12 = table->Flags;
        if ((uVar12 & 8) != 0) {
          TableFixColumnSortDirection(pIVar24);
          uVar12 = table->Flags;
          uVar14 = *(uint *)((long)&pIVar19->Flags + lVar21);
        }
        fVar32 = *(float *)((long)&pIVar19->WorkMinX + lVar21);
        fVar31 = *(float *)((long)&pIVar19->ContentMaxXFrozen + lVar21);
        fVar37 = *(float *)((long)&pIVar19->ContentMaxXUnfrozen + lVar21);
        uVar27 = -(uint)(fVar37 <= fVar31);
        fVar31 = (float)(~uVar27 & (uint)fVar37 | (uint)fVar31 & uVar27) - fVar32;
        if ((uVar14 & 0x1000) == 0 && (uVar12 & 0x20000) == 0) {
          fVar32 = *(float *)((long)&pIVar19->ContentMaxXHeadersIdeal + lVar21) - fVar32;
          uVar27 = -(uint)(fVar32 <= fVar31);
          fVar31 = (float)((uint)fVar31 & uVar27 | ~uVar27 & (uint)fVar32);
        }
        fVar32 = (float)(~-(uint)(fVar2 <= fVar31) & (uint)fVar2 |
                        (uint)fVar31 & -(uint)(fVar2 <= fVar31));
        if ((((uVar14 & 8) != 0) &&
            (fVar31 = *(float *)((long)&pIVar19->InitStretchWeightOrWidth + lVar21), 0.0 < fVar31))
           && (((uVar12 & 1) == 0 || ((uVar14 & 0x20) == 0)))) {
          fVar32 = (float)(~-(uint)(fVar31 <= fVar32) & (uint)fVar31 |
                          -(uint)(fVar31 <= fVar32) & (uint)fVar32);
        }
        *(float *)((long)&pIVar19->WidthAuto + lVar21) = fVar32;
        if ((uVar14 & 0x18) == 0) {
          if ((uVar14 & 4) == 0) {
            __assert_fail("column->Flags & ImGuiTableColumnFlags_WidthStretch",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                          ,0x2387,"void ImGui::TableUpdateLayout(ImGuiTable *)");
          }
          if ((&pIVar19->AutoFitQueue)[lVar21] == '\0') {
            fVar31 = *(float *)((long)&pIVar19->StretchWeight + lVar21);
          }
          else {
            fVar31 = *(float *)((long)&pIVar19->InitStretchWeightOrWidth + lVar21);
            uVar14 = -(uint)(0.0 < fVar31);
            fVar31 = (float)(~uVar14 & 0x3f800000 | (uint)fVar31 & uVar14);
            *(float *)((long)&pIVar19->StretchWeight + lVar21) = fVar31;
          }
          local_c8._0_4_ = (float)local_c8._0_4_ + fVar31;
          if ((table->LeftMostStretchedColumnDisplayOrder == -1) ||
             ((&pIVar19->DisplayOrder)[lVar21] < table->LeftMostStretchedColumnDisplayOrder)) {
            table->LeftMostStretchedColumnDisplayOrder = (&pIVar19->DisplayOrder)[lVar21];
          }
        }
        else {
          if ((&pIVar19->AutoFitQueue)[lVar21] == '\0') {
            if (((uVar14 & 0x10) != 0) && ((&pIVar19->IsClipped)[lVar21] == false)) {
              *(float *)((long)&pIVar19->WidthRequest + lVar21) = fVar32;
            }
          }
          else {
            *(float *)((long)&pIVar19->WidthRequest + lVar21) = fVar32;
            if (((&pIVar19->AutoFitQueue)[lVar21] != '\x01') && (table->IsInitializing == true)) {
              *(uint *)((long)&pIVar19->WidthRequest + lVar21) =
                   ~-(uint)((float)local_58._0_4_ <= fVar32) & local_58._0_4_ |
                   -(uint)((float)local_58._0_4_ <= fVar32) & (uint)fVar32;
            }
          }
          iVar15 = iVar15 + 1;
          fVar36 = fVar36 + *(float *)((long)&pIVar19->WidthRequest + lVar21);
        }
        fVar33 = (float)((uint)fVar33 & -(uint)(fVar32 <= fVar33) |
                        ~-(uint)(fVar32 <= fVar33) & (uint)fVar32);
        fVar32 = table->CellPaddingX;
        fVar36 = fVar36 + fVar32 + fVar32;
        uVar14 = table->ColumnsCount;
      }
      uVar23 = uVar23 + 1;
      lVar21 = lVar21 + 0x68;
    } while ((long)uVar23 < (long)(int)uVar14);
  }
  table->ColumnsVisibleFixedCount = (ImS8)iVar15;
  uVar12 = table->Flags;
  uVar23 = (ulong)uVar14;
  if (0 < (int)uVar14 && (uVar12 >> 0x10 & 1) != 0) {
    uVar25 = table->VisibleMaskByIndex;
    lVar21 = 0x30;
    uVar17 = 0;
    do {
      if ((uVar25 >> (uVar17 & 0x3f) & 1) != 0) {
        pIVar24 = (table->Columns).Data;
        if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)pIVar24 + lVar21 + -0x30))
        goto LAB_002bf144;
        if ((*(byte *)((long)pIVar24 + lVar21 + -0x18) & 0x18) == 0) {
          local_c8._0_4_ = (float)local_c8._0_4_ + (1.0 - *(float *)((long)pIVar24 + lVar21 + -8));
          *(undefined4 *)((long)pIVar24 + lVar21 + -8) = 0x3f800000;
          if (iVar15 < 1) goto LAB_002be8fd;
          pfVar20 = (float *)((long)&(pIVar24->ClipRect).Min.x + lVar21);
        }
        else {
          pfVar20 = &pIVar24[uVar17].WidthRequest;
          fVar36 = fVar36 + (fVar33 - *(float *)((long)&(pIVar24->ClipRect).Min.x + lVar21));
        }
        *pfVar20 = fVar33;
      }
LAB_002be8fd:
      uVar17 = uVar17 + 1;
      lVar21 = lVar21 + 0x68;
    } while (uVar23 != uVar17);
  }
  bVar16 = (byte)(uVar12 >> 0x10) & 0 < iVar15;
  fVar33 = table->OuterPaddingX + table->OuterPaddingX +
           (float)(table->ColumnsVisibleCount + -1) * (table->CellSpacingX1 + table->CellSpacingX2);
  if ((((uVar12 >> 0x19 & 1) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth))) {
    fVar38 = fVar38 - fVar29;
  }
  else {
    fVar38 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar36 = (fVar38 - fVar33) - fVar36;
  fVar38 = 0.0;
  if (bVar16 == 0) {
    fVar38 = fVar36;
  }
  table->ColumnsTotalWidth = fVar33;
  table->ColumnsAutoFitWidth = fVar33;
  if ((int)uVar14 < 1) {
    bVar26 = true;
  }
  else {
    uVar25 = table->VisibleMaskByDisplayOrder;
    uVar17 = 0;
    iVar15 = 0;
    fVar31 = fVar33;
    do {
      if ((uVar25 >> (uVar17 & 0x3f) & 1) != 0) {
        pcVar18 = (table->DisplayOrderToIndex).Data + uVar17;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar18) goto LAB_002bf15b;
        lVar21 = (long)*pcVar18;
        if (lVar21 < 0) goto LAB_002bf144;
        pIVar24 = (table->Columns).Data;
        pIVar19 = pIVar24 + lVar21;
        if ((table->Columns).DataEnd <= pIVar19) goto LAB_002bf144;
        uVar27 = pIVar19->Flags;
        if ((uVar27 & 4) == 0) {
          if (pIVar19->NextVisibleColumn == -1) {
LAB_002bea8c:
            if (table->LeftMostStretchedColumnDisplayOrder != -1) {
              uVar27 = uVar27 | 0x40000000;
              goto LAB_002bea9c;
            }
          }
        }
        else {
          if (bVar16 == 0) {
            fVar37 = (pIVar19->StretchWeight / (float)local_c8._0_4_) * fVar36;
            uVar28 = -(uint)(fVar2 <= fVar37);
            fVar37 = (float)(int)((float)(~uVar28 & (uint)fVar2 | (uint)fVar37 & uVar28) + 0.01);
            pIVar19->WidthRequest = fVar37;
            fVar38 = fVar38 - fVar37;
          }
          cVar7 = pIVar19->NextVisibleColumn;
          if ((long)cVar7 == -1) goto LAB_002bea8c;
          if ((cVar7 < '\0') || (pIVar24 = pIVar24 + cVar7, (table->Columns).DataEnd <= pIVar24))
          goto LAB_002bf144;
          uVar28 = pIVar24->Flags;
          if ((uVar28 & 8) == 0) goto LAB_002beaa0;
          uVar27 = uVar27 | uVar28 & 0x40000000;
LAB_002bea9c:
          pIVar19->Flags = uVar27;
        }
LAB_002beaa0:
        iVar15 = iVar15 + (uint)((uVar27 & 0x20) == 0);
        uVar27 = -(uint)(fVar2 <= pIVar19->WidthRequest);
        fVar37 = (float)(int)(float)(~uVar27 & (uint)fVar2 | (uint)pIVar19->WidthRequest & uVar27);
        pIVar19->WidthGiven = fVar37;
        fVar33 = fVar33 + fVar37 + fVar32 + fVar32;
        fVar31 = fVar31 + pIVar19->WidthAuto + fVar32 + fVar32;
        table->ColumnsTotalWidth = fVar33;
        table->ColumnsAutoFitWidth = fVar31;
      }
      uVar17 = uVar17 + 1;
    } while (uVar23 != uVar17);
    bVar26 = iVar15 == 0;
  }
  if ((((uVar12 >> 0x14 & 1) == 0) && (1.0 <= fVar38)) &&
     ((0 < (int)uVar14 && (0.0 < (float)local_c8._0_4_)))) {
    uVar25 = table->VisibleMaskByDisplayOrder;
    do {
      uVar17 = uVar23 - 1;
      if ((uVar25 >> (uVar17 & 0x3f) & 1) != 0) {
        pcVar18 = (table->DisplayOrderToIndex).Data + uVar17;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar18) goto LAB_002bf15b;
        lVar21 = (long)*pcVar18;
        if ((lVar21 < 0) ||
           (pIVar24 = (table->Columns).Data + lVar21, (table->Columns).DataEnd <= pIVar24))
        goto LAB_002bf144;
        if ((pIVar24->Flags & 4) != 0) {
          uVar3 = pIVar24->WidthRequest;
          uVar5 = pIVar24->WidthGiven;
          pIVar24->WidthRequest = (float)uVar3 + 1.0;
          pIVar24->WidthGiven = (float)uVar5 + 1.0;
          fVar38 = fVar38 + -1.0;
        }
      }
    } while ((1.0 <= fVar38) && (bVar10 = 1 < uVar23, uVar23 = uVar17, bVar10));
  }
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar32 = (table->OuterRect).Max.y;
  local_40.Min = (table->OuterRect).Min;
  fVar38 = local_40.Min.y + table->LastOuterHeight;
  uVar14 = -(uint)(fVar38 <= fVar32);
  local_40.Max.y = (float)(uVar14 & (uint)fVar32 | ~uVar14 & (uint)fVar38);
  bVar10 = ItemHoverable(&local_40,0);
  fVar32 = fVar29;
  if ('\0' < table->FreezeColumnsCount) {
    fVar32 = (table->OuterRect).Min.x;
  }
  local_68.Min.x = (table->InnerClipRect).Min.x;
  local_68.Min.y = (table->InnerClipRect).Min.y;
  local_68.Max.x = (table->InnerClipRect).Max.x;
  local_68.Max.y = (table->InnerClipRect).Max.y;
  uVar23 = (ulong)(uint)table->ColumnsCount;
  if (0 < table->ColumnsCount) {
    fVar32 = (fVar32 + table->OuterPaddingX) - table->CellSpacingX1;
    iVar22 = 0;
    uVar25 = 0;
    iVar15 = 0;
    do {
      pbVar13 = (byte *)((table->DisplayOrderToIndex).Data + uVar25);
      if ((table->DisplayOrderToIndex).DataEnd <= pbVar13) goto LAB_002bf15b;
      bVar16 = *pbVar13;
      if (((long)(char)bVar16 < 0) ||
         (pIVar24 = (table->Columns).Data + (char)bVar16, (table->Columns).DataEnd <= pIVar24))
      goto LAB_002bf144;
      cVar7 = table->FreezeColumnsCount;
      pIVar24->NavLayerCurrent = '\0' < table->FreezeRowsCount || (char)bVar16 < cVar7;
      if (iVar15 == cVar7 && '\0' < cVar7) {
        fVar32 = fVar32 + (fVar29 - (table->OuterRect).Min.x);
      }
      if ((table->VisibleMaskByDisplayOrder >> (uVar25 & 0x3f) & 1) == 0) {
        (pIVar24->ClipRect).Max.x = fVar32;
        (pIVar24->ClipRect).Min.x = fVar32;
        pIVar24->WorkMinX = fVar32;
        pIVar24->MaxX = fVar32;
        pIVar24->MinX = fVar32;
        pIVar24->WidthGiven = 0.0;
        (pIVar24->ClipRect).Min.y = fVar1;
        (pIVar24->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar24->ClipRect,&local_68);
        pIVar24->IsClipped = true;
        pIVar24->IsSkipItems = true;
        pIVar24->ItemWidth = 1.0;
      }
      else {
        if (((uint)table->Flags >> 0x19 & 1) == 0) {
          fVar38 = table->CellPaddingX;
          fVar36 = table->CellSpacingX2;
          if (((uint)table->Flags >> 0x13 & 1) == 0) {
            fVar33 = (((((table->WorkRect).Max.x -
                        (float)(~(int)pIVar24->IndexWithinVisibleSet +
                               (int)table->ColumnsVisibleCount) * fVar30) - fVar32) - fVar36) -
                     (fVar38 + fVar38)) - table->OuterPaddingX;
          }
          else {
LAB_002bedf9:
            fVar33 = 3.4028235e+38;
          }
        }
        else {
          fVar38 = table->CellPaddingX;
          fVar36 = table->CellSpacingX2;
          if ((long)table->FreezeColumnsRequest <= (long)uVar25) goto LAB_002bedf9;
          fVar33 = (((((table->InnerClipRect).Max.x -
                      (float)(table->FreezeColumnsRequest + iVar22) * fVar30) - fVar32) -
                    table->OuterPaddingX) - fVar38) - fVar36;
        }
        uVar4 = pIVar24->WidthRequest;
        uVar6 = pIVar24->WidthGiven;
        auVar34._4_4_ = uVar6;
        auVar34._0_4_ = uVar4;
        auVar34._8_8_ = 0;
        auVar35._4_4_ = fVar33;
        auVar35._0_4_ = fVar2;
        auVar35._8_8_ = 0;
        auVar35 = minps(auVar34,auVar35);
        uVar14 = -(uint)(auVar35._0_4_ <= auVar35._4_4_);
        fVar31 = (float)(~uVar14 & (uint)auVar35._0_4_ | (uint)auVar35._4_4_ & uVar14);
        pIVar24->WidthGiven = fVar31;
        pIVar24->MinX = fVar32;
        fVar33 = table->CellSpacingX1;
        fVar37 = fVar38 + fVar38 + fVar31 + fVar32 + fVar33 + fVar36;
        pIVar24->MaxX = fVar37;
        pIVar24->WorkMinX = fVar32 + fVar38 + fVar33;
        pIVar24->WorkMaxX = (fVar37 - fVar38) - fVar36;
        pIVar24->ItemWidth = (float)(int)(fVar31 * 0.65);
        (pIVar24->ClipRect).Min.x = fVar32;
        (pIVar24->ClipRect).Min.y = fVar1;
        (pIVar24->ClipRect).Max.x = fVar37;
        (pIVar24->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar24->ClipRect,&local_68);
        fVar38 = (pIVar24->ClipRect).Min.x;
        if ((fVar38 < (pIVar24->ClipRect).Max.x) || ((pIVar24->AutoFitQueue & 1) != 0)) {
          pIVar24->IsClipped = false;
        }
        else {
          pIVar24->IsClipped = (bool)(~pIVar24->CannotSkipItemsQueue & 1);
          if ((pIVar24->CannotSkipItemsQueue & 1) == 0) {
            table->VisibleUnclippedMaskByIndex =
                 table->VisibleUnclippedMaskByIndex &
                 (-2L << (bVar16 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar16 & 0x3f));
          }
        }
        bVar11 = true;
        if (pIVar24->IsVisible == true) {
          bVar11 = table->HostSkipItems;
        }
        pIVar24->IsSkipItems = bVar11;
        if (((bVar10) && (fVar36 = (pIVar9->IO).MousePos.x, fVar38 <= fVar36)) &&
           (fVar36 < (pIVar24->ClipRect).Max.x)) {
          table->HoveredColumnBody = bVar16;
        }
        fVar38 = pIVar24->WorkMinX;
        pIVar24->ContentMaxXFrozen = fVar38;
        pIVar24->ContentMaxXUnfrozen = fVar38;
        pIVar24->ContentMaxXHeadersUsed = fVar38;
        pIVar24->ContentMaxXHeadersIdeal = fVar38;
        if (table->HostSkipItems == false) {
          pIVar24->AutoFitQueue = pIVar24->AutoFitQueue >> 1;
          pIVar24->CannotSkipItemsQueue = pIVar24->CannotSkipItemsQueue >> 1;
        }
        if (iVar15 < table->FreezeColumnsCount) {
          fVar38 = pIVar24->MaxX + 1.0;
          uVar14 = -(uint)(fVar38 <= local_68.Min.x);
          local_68.Min.x = (float)(~uVar14 & (uint)fVar38 | (uint)local_68.Min.x & uVar14);
        }
        fVar32 = fVar32 + table->CellPaddingX + table->CellPaddingX +
                          pIVar24->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
        iVar15 = iVar15 + 1;
      }
      uVar25 = uVar25 + 1;
      uVar23 = (ulong)table->ColumnsCount;
      iVar22 = iVar22 + -1;
    } while ((long)uVar25 < (long)uVar23);
  }
  if ((bVar10) && (table->HoveredColumnBody == -1)) {
    fVar29 = (table->WorkRect).Min.x;
    cVar7 = table->RightMostVisibleColumn;
    if ((long)cVar7 != -1) {
      if ((cVar7 < '\0') ||
         (pIVar24 = (table->Columns).Data + cVar7, (table->Columns).DataEnd <= pIVar24)) {
LAB_002bf144:
        pcVar18 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
        goto LAB_002bf170;
      }
      fVar1 = (pIVar24->ClipRect).Max.x;
      uVar14 = -(uint)(fVar1 <= fVar29);
      fVar29 = (float)((uint)fVar29 & uVar14 | ~uVar14 & (uint)fVar1);
    }
    if (fVar29 <= (pIVar9->IO).MousePos.x) {
      table->HoveredColumnBody = (ImS8)uVar23;
    }
  }
  if ((bVar26) && ((table->Flags & 1U) != 0)) {
    table->Flags = table->Flags & 0xfffffffe;
  }
  TableUpdateDrawChannels(table);
  if ((table->Flags & 1) != 0) {
    TableUpdateBorders(table);
  }
  table->LastFirstRowHeight = 0.0;
  table->IsLayoutLocked = true;
  table->IsUsingHeaders = false;
  if ((table->IsContextPopupOpen == true) && (table->InstanceCurrent == table->InstanceInteracted))
  {
    id = ImHashStr("##ContextMenu",0,table->ID);
    bVar26 = BeginPopupEx(id,0x141);
    if (bVar26) {
      TableDrawContextMenu(table);
      EndPopup();
    }
    else {
      table->IsContextPopupOpen = false;
    }
  }
  pIVar8 = table->InnerWindow;
  if ((table->Flags & 0x200000) == 0) {
    ImDrawList::PushClipRect(pIVar8->DrawList,(pIVar8->ClipRect).Min,(pIVar8->ClipRect).Max,false);
  }
  else {
    ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar8->DrawList,2);
  }
  if ((table->IsSortSpecsDirty == true) && ((table->Flags & 8) != 0)) {
    TableSortSpecsBuild(table);
  }
  return;
LAB_002bf15b:
  pcVar18 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
LAB_002bf170:
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_internal.h"
                ,0x217,pcVar18);
}

Assistant:

void    ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;

    // Compute offset, clip rect for the frame
    // (can't make auto padding larger than what WorkRect knows about so right-alignment matches)
    const ImRect work_rect = table->WorkRect;
    const float min_column_width = TableGetMinColumnWidth();
    const float min_column_distance = min_column_width + table->CellPaddingX * 2.0f + table->CellSpacingX1 + table->CellSpacingX2;

    int count_fixed = 0;
    float sum_weights_stretched = 0.0f;     // Sum of all weights for weighted columns.
    float sum_width_fixed_requests = 0.0f;  // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns.
    float max_width_auto = 0.0f;
    table->LeftMostStretchedColumnDisplayOrder = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->VisibleMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Adjust flags: default width mode + weighted columns are not allowed when auto extending
        // FIXME-TABLE: Clarify why we need to do this again here and not just in TableSetupColumn()
        column->Flags = TableFixColumnFlags(table, column->FlagsIn);
        if ((column->Flags & ImGuiTableColumnFlags_IndentMask_) == 0)
            column->Flags |= (column_n == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

        // We have a unusual edge case where if the user doesn't call TableGetSortSpecs() but has sorting enabled
        // or varying sorting flags, we still want the sorting arrows to honor those flags.
        if (table->Flags & ImGuiTableFlags_Sortable)
            TableFixColumnSortDirection(column);

        // Calculate "ideal" column width for nothing to be clipped.
        // Combine width from regular rows + width from headers unless requested not to.
        const float content_width_body = (float)ImMax(column->ContentMaxXFrozen, column->ContentMaxXUnfrozen) - column->WorkMinX;
        const float content_width_headers = (float)column->ContentMaxXHeadersIdeal - column->WorkMinX;
        float width_auto = content_width_body;
        if (!(table->Flags & ImGuiTableFlags_NoHeadersWidth) && !(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
            width_auto = ImMax(width_auto, content_width_headers);
        width_auto = ImMax(width_auto, min_column_width);

        // Non-resizable columns also submit their requested width
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f)
            if (!(table->Flags & ImGuiTableFlags_Resizable) || !(column->Flags & ImGuiTableColumnFlags_NoResize))
                width_auto = ImMax(width_auto, column->InitStretchWeightOrWidth);

        column->WidthAuto = width_auto;

        if (column->Flags & (ImGuiTableColumnFlags_WidthFixed | ImGuiTableColumnFlags_WidthAutoResize))
        {
            // Process auto-fit for non-stretched columns
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if ((column->AutoFitQueue != 0x00) || ((column->Flags & ImGuiTableColumnFlags_WidthAutoResize) && !column->IsClipped))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            if (column->AutoFitQueue > 0x01 && table->IsInitializing)
                column->WidthRequest = ImMax(column->WidthRequest, min_column_width * 4.0f); // FIXME-TABLE: Another constant/scale?

            count_fixed += 1;
            sum_width_fixed_requests += column->WidthRequest;
        }
        else
        {
            IM_ASSERT(column->Flags & ImGuiTableColumnFlags_WidthStretch);
            const float default_weight = (column->InitStretchWeightOrWidth > 0.0f) ? column->InitStretchWeightOrWidth : 1.0f;
            if (column->AutoFitQueue != 0x00)
                column->StretchWeight = default_weight;
            sum_weights_stretched += column->StretchWeight;
            if (table->LeftMostStretchedColumnDisplayOrder == -1 || table->LeftMostStretchedColumnDisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumnDisplayOrder = (ImS8)column->DisplayOrder;
        }
        max_width_auto = ImMax(max_width_auto, width_auto);
        sum_width_fixed_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsVisibleFixedCount = (ImS8)count_fixed;

    // Apply "same widths"
    // - When all columns are fixed or columns are of mixed type: use the maximum auto width
    // - When all columns are stretch: use same weight
    const bool mixed_same_widths = (table->Flags & ImGuiTableFlags_SameWidths) && count_fixed > 0;
    if (table->Flags & ImGuiTableFlags_SameWidths)
    {
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            if (table->VisibleMaskByIndex & ((ImU64)1 << column_n))
            {
                ImGuiTableColumn* column = &table->Columns[column_n];
                if (column->Flags & (ImGuiTableColumnFlags_WidthFixed | ImGuiTableColumnFlags_WidthAutoResize))
                {
                    sum_width_fixed_requests += max_width_auto - column->WidthRequest; // Update old sum
                    column->WidthRequest = max_width_auto;
                }
                else
                {
                    sum_weights_stretched += 1.0f - column->StretchWeight; // Update old sum
                    column->StretchWeight = 1.0f;
                    if (count_fixed > 0)
                        column->WidthRequest = max_width_auto;
                }
            }
    }

    // Layout
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsVisibleCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = mixed_same_widths ? 0.0f : width_avail - width_spacings - sum_width_fixed_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;

    // Apply final width based on requested widths
    // Mark some columns as not resizable
    int count_resizable = 0;
    table->ColumnsTotalWidth = width_spacings;
    table->ColumnsAutoFitWidth = width_spacings;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];

        // Allocate width for stretched/weighted columns
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            // StretchWeight gets converted into WidthRequest
            if (!mixed_same_widths) 
            {
                float weight_ratio = column->StretchWeight / sum_weights_stretched;
                column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, min_column_width) + 0.01f);
                width_remaining_for_stretched_columns -= column->WidthRequest;
            }

            // [Resize Rule 2] Resizing from right-side of a stretch column preceding a fixed column
            // needs to forward resizing to left-side of fixed column. We also need to copy the NoResize flag..
            if (column->NextVisibleColumn != -1)
                if (ImGuiTableColumn* next_column = &table->Columns[column->NextVisibleColumn])
                    if (next_column->Flags & ImGuiTableColumnFlags_WidthFixed)
                        column->Flags |= (next_column->Flags & ImGuiTableColumnFlags_NoDirectResize_);
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // (see comments in TableResizeColumn())
        if (column->NextVisibleColumn == -1 && table->LeftMostStretchedColumnDisplayOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        if (!(column->Flags & ImGuiTableColumnFlags_NoResize))
            count_resizable++;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, min_column_width));
        table->ColumnsTotalWidth += column->WidthGiven + table->CellPaddingX * 2.0f;
        table->ColumnsAutoFitWidth += column->WidthAuto + table->CellPaddingX * 2.0f;
    }

    // Redistribute remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor), could be adjusted depending
    // on where the mouse cursor is and/or relative weights.
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; sum_weights_stretched > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    // Detect hovered column
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // Setup final position, offset and clipping rectangles
    int visible_n = 0;
    float offset_x = (table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x;
    offset_x += table->OuterPaddingX;
    offset_x -= table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (table->FreezeColumnsCount > 0 && table->FreezeColumnsCount == visible_n)
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;

        if ((table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsClipped = column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Maximum width
        float max_width = FLT_MAX;
        if (table->Flags & ImGuiTableFlags_ScrollX)
        {
            // Frozen columns can't reach beyond visible width else scrolling will naturally break.
            if (order_n < table->FreezeColumnsRequest)
            {
                max_width = (table->InnerClipRect.Max.x - (table->FreezeColumnsRequest - order_n) * min_column_distance) - offset_x;
                max_width = max_width - table->OuterPaddingX - table->CellPaddingX - table->CellSpacingX2;
            }
        }
        else if ((table->Flags & ImGuiTableFlags_NoKeepColumnsVisible) == 0)
        {
            // If horizontal scrolling if disabled, we apply a final lossless shrinking of columns in order to make
            // sure they are all visible. Because of this we also know that all of the columns will always fit in
            // table->WorkRect and therefore in table->InnerRect (because ScrollX is off)
            // FIXME-TABLE: This is solved incorrectly but also quite a difficult problem to fix as we also want ClipRect width to match.
            // See "table_width_distrib" and "table_width_keep_visible" tests
            max_width = table->WorkRect.Max.x - (table->ColumnsVisibleCount - column->IndexWithinVisibleSet - 1) * min_column_distance - offset_x;
            //max_width -= table->CellSpacingX1;
            max_width -= table->CellSpacingX2;
            max_width -= table->CellPaddingX * 2.0f;
            max_width -= table->OuterPaddingX;
        }
        column->WidthGiven = ImMin(column->WidthGiven, max_width);

        // Minimum width
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, min_column_width));

        // Lock all our positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) is detrimental to visibility in very-small column.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->MinX = offset_x;
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; // column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        column->IsClipped = (column->ClipRect.Max.x <= column->ClipRect.Min.x) && (column->AutoFitQueue & 1) == 0 && (column->CannotSkipItemsQueue & 1) == 0;
        if (column->IsClipped)
            table->VisibleUnclippedMaskByIndex &= ~((ImU64)1 << column_n); // Columns with the _WidthAutoResize sizing policy will never be updated then.

        column->IsSkipItems = !column->IsVisible || table->HostSkipItems;

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImS8)column_n;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImMax(host_clip_rect.Min.x, column->MaxX + TABLE_BORDER_SIZE);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        float unused_x1 = table->WorkRect.Min.x;
        if (table->RightMostVisibleColumn != -1)
            unused_x1 = ImMax(unused_x1, table->Columns[table->RightMostVisibleColumn].ClipRect.Max.x);
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImS8)table->ColumnsCount;
    }

    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag,
    // either because of using _WidthAutoResize/_WidthStretch).
    // This will hide the resizing option from the context menu.
    if (count_resizable == 0 && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // Allocate draw channels
    TableUpdateDrawChannels(table);

    // Borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);

    // Reset fields after we used them in TableSetupResize()
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_UNCLIPPED);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);

    // Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);
}